

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.h
# Opt level: O2

void Eigen::internal::quaternionbase_assign_impl<Eigen::Matrix<float,3,3,0,3,3>,3,3>::
     run<Eigen::Quaternion<float,0>>
               (QuaternionBase<Eigen::Quaternion<float,_0>_> *q,Matrix<float,_3,_3,_0,_3,_3> *a_mat)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  fVar9 = (a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
  fVar1 = (a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[4];
  fVar2 = (a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[8];
  fVar8 = fVar1 + fVar2 + fVar9;
  if (fVar8 <= 0.0) {
    pfVar3 = (a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array + 3;
    if (fVar1 <= fVar9) {
      pfVar3 = (float *)a_mat;
    }
    uVar6 = 2;
    if (fVar2 < pfVar3[fVar9 < fVar1] || fVar2 == pfVar3[fVar9 < fVar1]) {
      uVar6 = (ulong)(fVar9 < fVar1);
    }
    lVar4 = 0;
    if (uVar6 + 1 != 3) {
      lVar4 = uVar6 + 1;
    }
    uVar5 = lVar4 - 2;
    if (lVar4 + 1U < 3) {
      uVar5 = lVar4 + 1U;
    }
    fVar9 = (((a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[uVar6 * 4] -
             (a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[lVar4 * 4]) -
            (a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[uVar5 * 4]) + 1.0;
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    uVar7 = (ulong)(uint)((int)uVar6 << 2);
    *(float *)(q + uVar7) = fVar9 * 0.5;
    fVar9 = 0.5 / fVar9;
    *(float *)(q + 0xc) =
         ((a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[lVar4 * 3 + uVar5] -
         (a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [uVar5 * 3 + lVar4]) * fVar9;
    *(float *)(q + lVar4 * 4) =
         ((a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[uVar6 * 3 + lVar4] +
         *(float *)((long)(a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array + uVar7 + lVar4 * 0xc)) * fVar9;
    *(float *)(q + uVar5 * 4) =
         ((a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[uVar6 * 3 + uVar5] +
         *(float *)((long)(a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array + uVar7 + uVar5 * 0xc)) * fVar9;
  }
  else {
    fVar8 = fVar8 + 1.0;
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    *(float *)(q + 0xc) = fVar8 * 0.5;
    fVar8 = 0.5 / fVar8;
    *(float *)q = ((a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
                  (a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[7]) * fVar8;
    *(float *)(q + 4) =
         ((a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[6] -
         (a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [2]) * fVar8;
    *(float *)(q + 8) =
         ((a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[1] -
         (a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3]) * fVar8;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC static inline void run(QuaternionBase<Derived>& q, const Other& a_mat)
  {
    const typename internal::nested_eval<Other,2>::type mat(a_mat);
    EIGEN_USING_STD(sqrt)
    // This algorithm comes from  "Quaternion Calculus and Fast Animation",
    // Ken Shoemake, 1987 SIGGRAPH course notes
    Scalar t = mat.trace();
    if (t > Scalar(0))
    {
      t = sqrt(t + Scalar(1.0));
      q.w() = Scalar(0.5)*t;
      t = Scalar(0.5)/t;
      q.x() = (mat.coeff(2,1) - mat.coeff(1,2)) * t;
      q.y() = (mat.coeff(0,2) - mat.coeff(2,0)) * t;
      q.z() = (mat.coeff(1,0) - mat.coeff(0,1)) * t;
    }
    else
    {
      Index i = 0;
      if (mat.coeff(1,1) > mat.coeff(0,0))
        i = 1;
      if (mat.coeff(2,2) > mat.coeff(i,i))
        i = 2;
      Index j = (i+1)%3;
      Index k = (j+1)%3;

      t = sqrt(mat.coeff(i,i)-mat.coeff(j,j)-mat.coeff(k,k) + Scalar(1.0));
      q.coeffs().coeffRef(i) = Scalar(0.5) * t;
      t = Scalar(0.5)/t;
      q.w() = (mat.coeff(k,j)-mat.coeff(j,k))*t;
      q.coeffs().coeffRef(j) = (mat.coeff(j,i)+mat.coeff(i,j))*t;
      q.coeffs().coeffRef(k) = (mat.coeff(k,i)+mat.coeff(i,k))*t;
    }
  }